

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_avx2.c
# Opt level: O0

void aom_int_pro_row_avx2
               (int16_t *hbuf,uint8_t *ref,int ref_stride,int width,int height,int norm_factor)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined8 *puVar5;
  undefined1 (*pauVar6) [32];
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  uint in_R9D;
  __m256i t1;
  __m256i t0;
  __m256i src_line;
  int idx;
  __m256i s1;
  __m256i s0;
  int16_t *hbuf_tmp;
  uint8_t *ref_tmp;
  int wd;
  __m256i zero;
  undefined1 in_stack_fffffffffffffb20 [32];
  int16_t *in_stack_fffffffffffffb40;
  int local_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 (*local_410) [32];
  int local_404;
  
  if (in_ECX % 0x20 == 0) {
    for (local_404 = 0; local_404 < in_ECX; local_404 = local_404 + 0x20) {
      local_410 = (undefined1 (*) [32])(in_RSI + local_404);
      puVar5 = (undefined8 *)(in_RDI + (long)local_404 * 2);
      local_440 = ZEXT1632(ZEXT816(0));
      local_460 = ZEXT1632(ZEXT816(0));
      local_464 = 0;
      do {
        auVar3 = vpunpcklbw_avx2(*local_410,ZEXT1632(ZEXT816(0)));
        auVar1 = vpunpckhbw_avx2(*local_410,ZEXT1632(ZEXT816(0)));
        auVar3 = vpaddw_avx2(local_440,auVar3);
        auVar1 = vpaddw_avx2(local_460,auVar1);
        pauVar6 = (undefined1 (*) [32])(*local_410 + in_EDX);
        auVar4 = vpunpcklbw_avx2(*pauVar6,ZEXT1632(ZEXT816(0)));
        auVar2 = vpunpckhbw_avx2(*pauVar6,ZEXT1632(ZEXT816(0)));
        local_440 = vpaddw_avx2(auVar3,auVar4);
        local_460 = vpaddw_avx2(auVar1,auVar2);
        local_410 = (undefined1 (*) [32])(*pauVar6 + in_EDX);
        local_464 = local_464 + 2;
      } while (local_464 < in_R8D);
      auVar3 = vpsraw_avx2(local_440,ZEXT416(in_R9D));
      auVar1 = vpsraw_avx2(local_460,ZEXT416(in_R9D));
      local_440._0_8_ = auVar3._0_8_;
      local_440._8_8_ = auVar3._8_8_;
      *puVar5 = local_440._0_8_;
      puVar5[1] = local_440._8_8_;
      local_460._0_8_ = auVar1._0_8_;
      local_460._8_8_ = auVar1._8_8_;
      puVar5[2] = local_460._0_8_;
      puVar5[3] = local_460._8_8_;
      local_440._16_8_ = auVar3._16_8_;
      local_440._24_8_ = auVar3._24_8_;
      puVar5[4] = local_440._16_8_;
      puVar5[5] = local_440._24_8_;
      local_460._16_8_ = auVar1._16_8_;
      local_460._24_8_ = auVar1._24_8_;
      puVar5[6] = local_460._16_8_;
      puVar5[7] = local_460._24_8_;
    }
  }
  else if (in_ECX % 0x10 == 0) {
    aom_int_pro_row_sse2
              (in_stack_fffffffffffffb40,in_stack_fffffffffffffb20._24_8_,
               in_stack_fffffffffffffb20._20_4_,in_stack_fffffffffffffb20._16_4_,
               in_stack_fffffffffffffb20._12_4_,in_stack_fffffffffffffb20._8_4_);
  }
  return;
}

Assistant:

void aom_int_pro_row_avx2(int16_t *hbuf, const uint8_t *ref,
                          const int ref_stride, const int width,
                          const int height, int norm_factor) {
  // SIMD implementation assumes width and height to be multiple of 16 and 2
  // respectively. For any odd width or height, SIMD support needs to be added.
  assert(width % 16 == 0 && height % 2 == 0);

  if (width % 32 == 0) {
    const __m256i zero = _mm256_setzero_si256();
    for (int wd = 0; wd < width; wd += 32) {
      const uint8_t *ref_tmp = ref + wd;
      int16_t *hbuf_tmp = hbuf + wd;
      __m256i s0 = zero;
      __m256i s1 = zero;
      int idx = 0;
      do {
        __m256i src_line = _mm256_loadu_si256((const __m256i *)ref_tmp);
        __m256i t0 = _mm256_unpacklo_epi8(src_line, zero);
        __m256i t1 = _mm256_unpackhi_epi8(src_line, zero);
        s0 = _mm256_add_epi16(s0, t0);
        s1 = _mm256_add_epi16(s1, t1);
        ref_tmp += ref_stride;

        src_line = _mm256_loadu_si256((const __m256i *)ref_tmp);
        t0 = _mm256_unpacklo_epi8(src_line, zero);
        t1 = _mm256_unpackhi_epi8(src_line, zero);
        s0 = _mm256_add_epi16(s0, t0);
        s1 = _mm256_add_epi16(s1, t1);
        ref_tmp += ref_stride;
        idx += 2;
      } while (idx < height);
      s0 = _mm256_srai_epi16(s0, norm_factor);
      s1 = _mm256_srai_epi16(s1, norm_factor);
      _mm_storeu_si128((__m128i *)(hbuf_tmp), _mm256_castsi256_si128(s0));
      _mm_storeu_si128((__m128i *)(hbuf_tmp + 8), _mm256_castsi256_si128(s1));
      _mm_storeu_si128((__m128i *)(hbuf_tmp + 16),
                       _mm256_extractf128_si256(s0, 1));
      _mm_storeu_si128((__m128i *)(hbuf_tmp + 24),
                       _mm256_extractf128_si256(s1, 1));
    }
  } else if (width % 16 == 0) {
    aom_int_pro_row_sse2(hbuf, ref, ref_stride, width, height, norm_factor);
  }
}